

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  int *piVar1;
  ImGuiWindow *pIVar2;
  float *pfVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  float *pfVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ImGuiContext *ctx;
  
  pIVar4 = GImGui;
  iVar8 = components + -1;
  pIVar2 = GImGui->CurrentWindow;
  fVar13 = (GImGui->Style).ItemInnerSpacing.x;
  fVar11 = (float)(int)((w_full - fVar13 * (float)iVar8) / (float)components);
  fVar12 = 1.0;
  if (1.0 <= fVar11) {
    fVar12 = fVar11;
  }
  fVar11 = (float)(int)(w_full - (fVar13 + fVar12) * (float)iVar8);
  fVar13 = 1.0;
  if (1.0 <= fVar11) {
    fVar13 = fVar11;
  }
  iVar5 = (pIVar2->DC).ItemWidthStack.Size;
  if (iVar5 == (pIVar2->DC).ItemWidthStack.Capacity) {
    if (iVar5 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar5 / 2 + iVar5;
    }
    iVar10 = iVar5 + 1;
    if (iVar5 + 1 < iVar7) {
      iVar10 = iVar7;
    }
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    pfVar6 = (float *)(*GImAllocatorAllocFunc)((long)iVar10 << 2,GImAllocatorUserData);
    pfVar3 = (pIVar2->DC).ItemWidthStack.Data;
    if (pfVar3 != (float *)0x0) {
      memcpy(pfVar6,pfVar3,(long)(pIVar2->DC).ItemWidthStack.Size << 2);
      pfVar3 = (pIVar2->DC).ItemWidthStack.Data;
      if ((pfVar3 != (float *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pfVar3,GImAllocatorUserData);
    }
    (pIVar2->DC).ItemWidthStack.Data = pfVar6;
    (pIVar2->DC).ItemWidthStack.Capacity = iVar10;
    iVar5 = (pIVar2->DC).ItemWidthStack.Size;
  }
  else {
    pfVar6 = (pIVar2->DC).ItemWidthStack.Data;
  }
  pfVar6[iVar5] = fVar13;
  uVar9 = (pIVar2->DC).ItemWidthStack.Size + 1;
  (pIVar2->DC).ItemWidthStack.Size = uVar9;
  if (1 < components) {
    do {
      if (uVar9 == (pIVar2->DC).ItemWidthStack.Capacity) {
        if (uVar9 == 0) {
          iVar5 = 8;
        }
        else {
          iVar5 = (int)uVar9 / 2 + uVar9;
        }
        iVar7 = uVar9 + 1;
        if ((int)(uVar9 + 1) < iVar5) {
          iVar7 = iVar5;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pfVar6 = (float *)(*GImAllocatorAllocFunc)((long)iVar7 << 2,GImAllocatorUserData);
        pfVar3 = (pIVar2->DC).ItemWidthStack.Data;
        if (pfVar3 != (float *)0x0) {
          memcpy(pfVar6,pfVar3,(long)(pIVar2->DC).ItemWidthStack.Size << 2);
          pfVar3 = (pIVar2->DC).ItemWidthStack.Data;
          if ((pfVar3 != (float *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pfVar3,GImAllocatorUserData);
        }
        (pIVar2->DC).ItemWidthStack.Data = pfVar6;
        (pIVar2->DC).ItemWidthStack.Capacity = iVar7;
        uVar9 = (pIVar2->DC).ItemWidthStack.Size;
      }
      else {
        pfVar6 = (pIVar2->DC).ItemWidthStack.Data;
      }
      pfVar6[(int)uVar9] = fVar12;
      uVar9 = (pIVar2->DC).ItemWidthStack.Size + 1;
      (pIVar2->DC).ItemWidthStack.Size = uVar9;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  if (0 < (int)uVar9) {
    (pIVar2->DC).ItemWidth = (pIVar2->DC).ItemWidthStack.Data[(ulong)uVar9 - 1];
    *(byte *)&(pIVar4->NextItemData).Flags = (byte)(pIVar4->NextItemData).Flags & 0xfe;
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.h"
                ,0x4e2,"T &ImVector<float>::back() [T = float]");
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiStyle& style = GImGui->Style;
    const float w_item_one  = ImMax(1.0f, (float)(int)((w_full - (style.ItemInnerSpacing.x) * (components-1)) / (float)components));
    const float w_item_last = ImMax(1.0f, (float)(int)(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components-1)));
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components-1; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = window->DC.ItemWidthStack.back();
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}